

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O1

AggregateFunction *
duckdb::GetEntropyFunction(AggregateFunction *__return_storage_ptr__,LogicalType *type)

{
  LogicalType *in_RDX;
  
  switch(type->physical_type_) {
  case UINT16:
    GetTypedEntropyFunction<unsigned_short,duckdb::ModeStandard<unsigned_short>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case INT16:
    GetTypedEntropyFunction<short,duckdb::ModeStandard<short>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case UINT32:
    GetTypedEntropyFunction<unsigned_int,duckdb::ModeStandard<unsigned_int>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case INT32:
    GetTypedEntropyFunction<int,duckdb::ModeStandard<int>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case UINT64:
    GetTypedEntropyFunction<unsigned_long,duckdb::ModeStandard<unsigned_long>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case INT64:
    GetTypedEntropyFunction<long,duckdb::ModeStandard<long>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case FLOAT:
    GetTypedEntropyFunction<float,duckdb::ModeStandard<float>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  case DOUBLE:
    GetTypedEntropyFunction<double,duckdb::ModeStandard<double>>
              (__return_storage_ptr__,(duckdb *)type,in_RDX);
    break;
  default:
    if (type->physical_type_ == VARCHAR) {
      GetTypedEntropyFunction<duckdb::string_t,duckdb::ModeString>
                (__return_storage_ptr__,(duckdb *)type,in_RDX);
      return __return_storage_ptr__;
    }
  case UINT64|UINT8:
    GetFallbackEntropyFunction(__return_storage_ptr__,type);
  }
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetEntropyFunction(const LogicalType &type) {
	switch (type.InternalType()) {
#ifndef DUCKDB_SMALLER_BINARY
	case PhysicalType::UINT16:
		return GetTypedEntropyFunction<uint16_t>(type);
	case PhysicalType::UINT32:
		return GetTypedEntropyFunction<uint32_t>(type);
	case PhysicalType::UINT64:
		return GetTypedEntropyFunction<uint64_t>(type);
	case PhysicalType::INT16:
		return GetTypedEntropyFunction<int16_t>(type);
	case PhysicalType::INT32:
		return GetTypedEntropyFunction<int32_t>(type);
	case PhysicalType::INT64:
		return GetTypedEntropyFunction<int64_t>(type);
	case PhysicalType::FLOAT:
		return GetTypedEntropyFunction<float>(type);
	case PhysicalType::DOUBLE:
		return GetTypedEntropyFunction<double>(type);
	case PhysicalType::VARCHAR:
		return GetTypedEntropyFunction<string_t, ModeString>(type);
#endif
	default:
		return GetFallbackEntropyFunction(type);
	}
}